

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessenger.cxx
# Opt level: O2

void __thiscall
cmMessenger::DisplayMessage
          (cmMessenger *this,MessageType t,string *text,cmListFileBacktrace *backtrace)

{
  char *pcVar1;
  ostringstream msg;
  ostream local_190;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
  if (t < (DEPRECATION_WARNING|AUTHOR_ERROR)) {
    pcVar1 = &DAT_00437fc8 + *(int *)(&DAT_00437fc8 + (ulong)t * 4);
  }
  else {
    pcVar1 = "CMake Warning";
  }
  std::operator<<(&local_190,pcVar1);
  cmListFileBacktrace::PrintTitle(backtrace,&local_190);
  printMessageText(&local_190,text);
  cmListFileBacktrace::PrintCallStack(backtrace,&local_190);
  displayMessage(t,(ostringstream *)&local_190);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
  return;
}

Assistant:

void cmMessenger::DisplayMessage(MessageType t, const std::string& text,
                                 const cmListFileBacktrace& backtrace) const
{
  std::ostringstream msg;
  if (!printMessagePreamble(t, msg)) {
    return;
  }

  // Add the immediate context.
  backtrace.PrintTitle(msg);

  printMessageText(msg, text);

  // Add the rest of the context.
  backtrace.PrintCallStack(msg);

  displayMessage(t, msg);
}